

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

size_t __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::FindOffset(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
             *this,int *key)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong index;
  const_reference this_00;
  pair<int,_int> *ppVar6;
  int *in_RSI;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_RDI;
  size_t offset;
  int nProbes;
  size_t baseOffset;
  int local_20;
  hash<int> local_19;
  ulong local_18;
  int *local_10;
  
  local_10 = in_RSI;
  sVar3 = std::hash<int>::operator()(&local_19,*in_RSI);
  sVar4 = capacity((HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
                    *)0x5a8cd8);
  local_18 = sVar3 & sVar4 - 1;
  local_20 = 0;
  while( true ) {
    lVar5 = local_18 + (long)(local_20 / 2);
    sVar3 = capacity((HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
                      *)0x5a8d49);
    index = lVar5 + (local_20 * local_20) / 2 & sVar3 - 1;
    this_00 = pstd::
              vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
              ::operator[](in_RDI,index);
    bVar2 = pstd::optional<std::pair<int,_int>_>::has_value(this_00);
    if (!bVar2) {
      return index;
    }
    iVar1 = *local_10;
    pstd::
    vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
    ::operator[](in_RDI,index);
    ppVar6 = pstd::optional<std::pair<int,_int>_>::operator->
                       ((optional<std::pair<int,_int>_> *)0x5a8da0);
    if (iVar1 == ppVar6->first) break;
    local_20 = local_20 + 1;
  }
  return index;
}

Assistant:

PBRT_CPU_GPU
    size_t FindOffset(const Key &key) const {
        size_t baseOffset = Hash()(key) & (capacity() - 1);
        for (int nProbes = 0;; ++nProbes) {
            // Quadratic probing.
            size_t offset =
                (baseOffset + nProbes / 2 + nProbes * nProbes / 2) & (capacity() - 1);
            if (table[offset].has_value() == false || key == table[offset]->first) {
                return offset;
            }
        }
    }